

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_2_5::Vec3<int>>(char *type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  int *piVar7;
  char *in_RDI;
  Box<Imath_2_5::Vec3<int>_> b_2;
  Vec3<int> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec3<int> size;
  uint major;
  Box<Imath_2_5::Vec3<int>_> b_1;
  uint i;
  vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> perms;
  Box<Imath_2_5::Vec3<int>_> b;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  Box<Imath_2_5::Vec3<int>_> *in_stack_ffffffffffffff20;
  Vec3<int> local_c4;
  vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *in_stack_ffffffffffffff50;
  Vec3<int> local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  Vec3<int> local_88;
  Vec3<int> local_7c;
  uint local_70;
  Vec3<int> local_6c [3];
  uint local_48;
  vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> local_38 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<int>_>::Box
            ((Box<Imath_2_5::Vec3<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  uVar1 = Imath_2_5::Box<Imath_2_5::Vec3<int>_>::majorAxis(in_stack_ffffffffffffff20);
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x394,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<int>]"
                 );
  }
  std::vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>::vector
            ((vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *)0x126073);
  permutations<Imath_2_5::Vec3<int>>(in_stack_ffffffffffffff50);
  local_48 = 0;
  while( true ) {
    uVar5 = (ulong)local_48;
    sVar6 = std::vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>::size
                      (local_38);
    if (sVar6 <= uVar5) {
      std::vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>::~vector
                ((vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *)
                 in_stack_ffffffffffffff20);
      local_90 = 0;
      do {
        uVar1 = local_90;
        uVar2 = Imath_2_5::Vec3<int>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        local_94 = 0;
        while( true ) {
          uVar2 = local_94;
          uVar3 = Imath_2_5::Vec3<int>::dimensions();
          if (uVar3 <= uVar2) break;
          Imath_2_5::Vec3<int>::Vec3(&local_a0,0);
          piVar7 = Imath_2_5::Vec3<int>::operator[](&local_a0,local_94);
          *piVar7 = 1;
          Imath_2_5::Vec3<int>::Vec3(&local_c4,0);
          Imath_2_5::Box<Imath_2_5::Vec3<int>_>::Box
                    (in_stack_ffffffffffffff20,
                     (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar1));
          uVar2 = Imath_2_5::Box<Imath_2_5::Vec3<int>_>::majorAxis(in_stack_ffffffffffffff20);
          if (uVar2 != local_94) {
            __assert_fail("b.majorAxis() == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                          ,0x3c2,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<int>]"
                         );
          }
          local_94 = local_94 + 1;
        }
        local_90 = local_90 + 1;
      } while( true );
    }
    Imath_2_5::Vec3<int>::Vec3(local_6c,0);
    std::vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>::operator[]
              (local_38,(ulong)local_48);
    Imath_2_5::Box<Imath_2_5::Vec3<int>_>::Box
              (in_stack_ffffffffffffff20,
               (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_70 = 0;
    in_stack_ffffffffffffff20 =
         (Box<Imath_2_5::Vec3<int>_> *)
         std::vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>::operator[]
                   (local_38,(ulong)local_48);
    Imath_2_5::Vec3<int>::Vec3(&local_88,0);
    Imath_2_5::Vec3<int>::operator-
              ((Vec3<int> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_8c = 1;
    while( true ) {
      in_stack_ffffffffffffff1c = local_8c;
      uVar1 = Imath_2_5::Vec3<int>::dimensions();
      if (uVar1 <= in_stack_ffffffffffffff1c) break;
      piVar7 = Imath_2_5::Vec3<int>::operator[](&local_7c,local_8c);
      in_stack_ffffffffffffff18 = *piVar7;
      piVar7 = Imath_2_5::Vec3<int>::operator[](&local_7c,local_70);
      if (*piVar7 < in_stack_ffffffffffffff18) {
        local_70 = local_8c;
      }
      local_8c = local_8c + 1;
    }
    in_stack_ffffffffffffff14 =
         Imath_2_5::Box<Imath_2_5::Vec3<int>_>::majorAxis(in_stack_ffffffffffffff20);
    if (in_stack_ffffffffffffff14 != local_70) break;
    local_48 = local_48 + 1;
  }
  __assert_fail("b.majorAxis() == major",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                ,0x3a9,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<int>]"
               );
}

Assistant:

void
testMajorAxis(const char *type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.majorAxis() == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), perms[i]);

            unsigned int major = 0;
            T size = perms[i] - T(0);
            for (unsigned int j = 1; j < T::dimensions(); j++)
                if (size[j] > size[major])
                    major = j;
                    
            assert(b.majorAxis() == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            for (unsigned int j = 0; j < T::dimensions(); j++)
            {
                T max(0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), max);
                assert(b.majorAxis() == j);
            }
        }
    }
}